

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:107:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:108:7)>
::getImpl(TransformPromiseNode<int,_int,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:107:7),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_test_c__:108:7)>
          *this,ExceptionOrValue *output)

{
  int *params_1;
  int local_2e4;
  ExceptionOr<int> depResult;
  ExceptionOr<int> local_178;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    params_1 = (this->errorHandler).line;
    if ((*params_1 != depResult.super_ExceptionOrValue.exception.ptr.field_1.value.line) &&
       (Debug::minSeverity < 3)) {
      local_2e4 = depResult.super_ExceptionOrValue.exception.ptr.field_1.value.line;
      Debug::log<char_const(&)[41],int&,int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x6c,ERROR,"\"failed: expected \" \"(line) == (e.getLine())\", line, e.getLine()",
                 (char (*) [41])"failed: expected (line) == (e.getLine())",params_1,&local_2e4);
    }
    local_178.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_178.value.ptr.isSet = true;
    local_178.value.ptr.field_1.value = 0x159;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_178);
  }
  else {
    if (depResult.value.ptr.isSet != true) goto LAB_001f4d83;
    local_178.value.ptr.field_1.value = depResult.value.ptr.field_1.value + 1;
    local_178.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_178.value.ptr.isSet = true;
    ExceptionOr<int>::operator=((ExceptionOr<int> *)output,&local_178);
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&local_178);
LAB_001f4d83:
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }